

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

status_t __thiscall libchars::commands::run(commands *this,filter_t mask_)

{
  editor *this_00;
  history hVar1;
  bool bVar2;
  char *pcVar3;
  history *phVar4;
  string local_50;
  
  build_commands(this);
  if ((this->super_edit_object).prompt._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&(this->super_edit_object).prompt);
  }
  this->mask = mask_;
  if (((this->edit).driver)->is_tty == false) {
    parse(this);
LAB_00111db1:
    return this->status;
  }
  this_00 = &this->edit;
  reset_status(this);
LAB_00111bd3:
  editor::edit(this_00,&this->super_edit_object,this->timeout);
  switch((this->edit).k) {
  case KEY_UP:
    phVar4 = this->remember;
    if (phVar4 == (history *)0x0) goto LAB_00111bd3;
    if (phVar4[8] == (history)0x0) {
      value_abi_cxx11_(&local_50,this);
      history::set(phVar4,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      phVar4 = this->remember;
    }
    bVar2 = history::prev(phVar4);
    break;
  case KEY_DOWN:
    phVar4 = this->remember;
    if ((phVar4 == (history *)0x0) || (phVar4[8] != (history)0x1)) goto LAB_00111bd3;
    bVar2 = history::next(phVar4);
    break;
  case KEY_PGUP:
    phVar4 = this->remember;
    if (phVar4 != (history *)0x0) {
      hVar1 = phVar4[8];
      if ((hVar1 == (history)0x1) &&
         (*(size_t *)(phVar4 + 0x58) != (this->super_edit_object).insert_idx)) {
        history::cancel(phVar4);
        phVar4 = this->remember;
        hVar1 = phVar4[8];
      }
      if (((byte)hVar1 & 1) == 0) {
        value_abi_cxx11_(&local_50,this);
        history::set(phVar4,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar2 = history::search(this->remember,(this->super_edit_object).insert_idx);
      }
      else {
        bVar2 = history::search_prev(phVar4);
      }
      goto LAB_00111d79;
    }
    goto LAB_00111bd3;
  case KEY_PGDN:
    phVar4 = this->remember;
    if (phVar4 != (history *)0x0) {
      hVar1 = phVar4[8];
      if ((hVar1 == (history)0x1) &&
         (*(size_t *)(phVar4 + 0x58) != (this->super_edit_object).insert_idx)) {
        history::cancel(phVar4);
        phVar4 = this->remember;
        hVar1 = phVar4[8];
      }
      if (((byte)hVar1 & 1) != 0) {
        bVar2 = history::search_next(phVar4);
LAB_00111d79:
        if (bVar2 != false) {
          pcVar3 = history::current(this->remember);
          (*(this->super_edit_object)._vptr_edit_object[3])
                    (this,pcVar3,*(undefined8 *)(this->remember + 0x58));
        }
      }
    }
    goto LAB_00111bd3;
  default:
    editor::newline(this_00);
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
    return EMPTY;
  case KEY_TAB:
    auto_complete(this);
    goto LAB_00111bd3;
  case KEY_ENTER:
    dump_tokens(this);
    editor::newline(this_00);
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
    phVar4 = this->remember;
    if (phVar4 != (history *)0x0) {
      if (((this->status == EMPTY) || (this->status == TERMINATED)) ||
         ((this->super_edit_object).buflen == 0)) {
        history::cancel(phVar4);
      }
      else {
        value_abi_cxx11_(&local_50,this);
        history::add(phVar4,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    goto LAB_00111db1;
  case KEY_HELP:
    goto switchD_00111bfe_caseD_10;
  case KEY_QUIT:
    editor::newline(this_00);
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
    return TERMINATED;
  case SEQ_TIMEOUT:
    return TIMEOUT;
  case FORCED_RET:
    return FORCED_RETURN;
  }
  if (bVar2 != false) {
    pcVar3 = history::current(this->remember);
    (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar3,0xffffffffffffffff);
  }
  goto LAB_00111bd3;
switchD_00111bfe_caseD_10:
  if ((this->super_edit_object).buflen <= (this->super_edit_object).insert_idx) {
    show_help(this);
  }
  goto LAB_00111bd3;
}

Assistant:

commands::status_t commands::run(command::filter_t mask_)
    {
        build_commands();

        if (this->prompt.empty())
          this->prompt = ">";
        this->mask = mask_;

        if (!edit.interactive()) {
          parse();
          return status;
        }
        else {
          // reset command structures before starting new command string
          reset_status();

          while (true) {
              (void)edit.edit(*this,timeout);
              switch (edit.key()) {
              case SEQ_TIMEOUT:
                  return TIMEOUT;
              case FORCED_RET:
                  return FORCED_RETURN;
              case KEY_ENTER:
                  //TODO: remove quotes from strings
                  dump_tokens();
                  edit.newline();
                  rewind();
                  // record current line in history
                  if (remember != NULL) {
                      if (status != TERMINATED && status != EMPTY && remember != NULL && length() > 0)
                          remember->add(value());
                      else
                          remember->cancel();
                  }
                  return status;
              case KEY_TAB:
                  auto_complete();
                  break;
              case KEY_HELP:
                  if (insert_idx >= length())
                      show_help();
                  break;
              case KEY_QUIT:
                  edit.newline();
                  rewind();
                  return TERMINATED;
              case KEY_UP:
                  if (remember != NULL) {
                      if (!remember->searching())
                          remember->set(value());
                      if (remember->prev())
                          set(remember->current());
                  }
                  break;
              case KEY_DOWN:
                  if (remember != NULL && remember->searching() && remember->next())
                      set(remember->current());
                  break;
              case KEY_PGUP:
                  if (remember != NULL) {
                      if (remember->searching() && remember->search_idx() != insert_idx)
                          remember->cancel();

                      if (!remember->searching()) {
                          remember->set(value());
                          if (remember->search(insert_idx)) {
                              set(remember->current(),remember->search_idx());
                          }
                      }
                      else {
                          if (remember->search_prev()) {
                              set(remember->current(),remember->search_idx());
                          }
                      }
                  }
                  break;
              case KEY_PGDN:
                  if (remember != NULL) {
                      if (remember->searching() && remember->search_idx() != insert_idx)
                          remember->cancel();

                      if (remember->searching() && remember->search_next())
                          set(remember->current(),remember->search_idx());
                  }
                  break;
              default:
                  edit.newline();
                  rewind();
                  return EMPTY;
              }
          }
        }

        return EMPTY;
    }